

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeBBox *a_rect,ON_SimpleArray<void_*> *a_result)

{
  bool bVar1;
  void *pvVar2;
  void *extraout_RAX;
  long lVar3;
  long lVar4;
  void *local_38;
  
  pvVar2 = (void *)(long)a_node->m_count;
  if (0 < (long)pvVar2) {
    local_38 = pvVar2;
    if (a_node->m_level < 1) {
      lVar3 = (long)pvVar2 * 0x38;
      lVar4 = 0;
      do {
        bVar1 = OverlapHelper(a_rect,(ON_RTreeBBox *)
                                     ((long)a_node->m_branch[0].m_rect.m_min + lVar4));
        pvVar2 = (void *)(ulong)bVar1;
        if (bVar1) {
          local_38 = *(void **)((long)(&a_node->m_branch[0].m_rect + 1) + lVar4);
          ON_SimpleArray<void_*>::Append(a_result,&local_38);
          pvVar2 = extraout_RAX;
        }
        lVar4 = lVar4 + 0x38;
      } while (lVar3 - lVar4 != 0);
    }
    else {
      lVar4 = (long)pvVar2 * 0x38;
      lVar3 = 0;
      do {
        bVar1 = OverlapHelper(a_rect,(ON_RTreeBBox *)
                                     ((long)a_node->m_branch[0].m_rect.m_min + lVar3));
        if (bVar1) {
          bVar1 = SearchHelper(*(ON_RTreeNode **)((long)(&a_node->m_branch[0].m_rect + 1) + lVar3),
                               a_rect,a_result);
        }
        pvVar2 = (void *)(ulong)bVar1;
        lVar3 = lVar3 + 0x38;
      } while (lVar4 - lVar3 != 0);
    }
  }
  return SUB81(pvVar2,0);
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, const ON_RTreeBBox* a_rect, ON_SimpleArray<void*> &a_result)
{
  int i, count;

  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      for( i=0; i < count; ++i )
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          if(!SearchHelper(branch[i].m_child, a_rect, a_result) )
          {
            return false; // Don't continue searching
          }
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      for(i=0; i < count; ++i)
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          // The (void*) cast is safe because branch[i].m_id is an ON__INT_PTR
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_PUSH
// Disable warning C4312: 'type cast' : conversion from 'const ON__INT_PTR' to 'void *' of greater size
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4312 )
#endif
          a_result.Append( (void*)branch[i].m_id );
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_POP
#endif
        }
      }
    }
  }

  return true; // Continue searching
}